

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O0

void __thiscall miniros::TransportUDP::disableRead(TransportUDP *this)

{
  mutex_type *pmVar1;
  scoped_lock<std::mutex> *in_RDI;
  scoped_lock<std::mutex> lock;
  int in_stack_00000070;
  int in_stack_00000074;
  PollSet *in_stack_00000078;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::scoped_lock<std::mutex>::scoped_lock(in_RDI,in_stack_ffffffffffffffd8);
  pmVar1 = in_RDI[0x13]._M_device;
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x50902e);
  if ((((ulong)pmVar1 & 0x100000000) == 0) && (((ulong)in_RDI[0x19]._M_device & 1) != 0)) {
    PollSet::delEvents(in_stack_00000078,in_stack_00000074,in_stack_00000070);
    *(undefined1 *)&in_RDI[0x19]._M_device = 0;
  }
  return;
}

Assistant:

void TransportUDP::disableRead()
{
  MINIROS_ASSERT(!(flags_ & SYNCHRONOUS));

  {
    std::scoped_lock<std::mutex> lock(close_mutex_);

    if (closed_)
    {
      return;
    }
  }

  if (expecting_read_)
  {
    poll_set_->delEvents(sock_, POLLIN);
    expecting_read_ = false;
  }
}